

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  TestEventListener *listener;
  undefined8 uVar2;
  UnitTestImpl *in_RDI;
  string *output_format;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_60 [8];
  char *in_stack_ffffffffffffffa8;
  XmlUnitTestResultPrinter *in_stack_ffffffffffffffb0;
  string local_30 [32];
  string *local_10;
  
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_10 = local_30;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
  if (bVar1) {
    this_00 = listeners(in_RDI);
    listener = (TestEventListener *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    std::__cxx11::string::c_str();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    TestEventListeners::SetDefaultXmlGenerator(this_00,listener);
    std::__cxx11::string::~string(local_60);
  }
  else {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff68);
    if (bVar1) {
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: unrecognized output format \"%s\" ignored.\n",uVar2);
      fflush(_stdout);
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    printf("WARNING: unrecognized output format \"%s\" ignored.\n",
           output_format.c_str());
    fflush(stdout);
  }
}